

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O1

void reusable_node_advance(ReusableNode *self)

{
  int32_t *piVar1;
  SubtreePool *pool;
  StackSlice *pSVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  TSLanguage *self_00;
  uint32_t uVar6;
  undefined8 uVar7;
  StackVersion SVar8;
  Subtree *pSVar9;
  _Bool _Var10;
  TSStateId state;
  uint uVar11;
  Subtree SVar12;
  StackEntry *pSVar13;
  TSParser *extraout_RAX;
  TSParser *__nmemb;
  ulong uVar14;
  long lVar15;
  uint extraout_EDX;
  uint32_t uVar16;
  uint32_t uVar17;
  ushort state_00;
  int iVar18;
  uint uVar19;
  StackVersion version1;
  int iVar20;
  TSSymbol symbol;
  Subtree SVar21;
  SubtreeHeapData *pSVar22;
  TSParser *self_01;
  int in_R8D;
  uint in_R9D;
  uint uVar23;
  int iVar24;
  int iVar25;
  SubtreeHeapData *unaff_R13;
  StackSlice *pSVar26;
  ulong uVar27;
  TSParser *pTVar28;
  bool bVar29;
  byte bVar30;
  StackSliceArray SVar31;
  Length result;
  undefined8 uStack_118;
  TableEntry TStack_110;
  undefined8 uStack_100;
  Subtree SStack_f8;
  StackVersion SStack_ec;
  uint uStack_e8;
  int iStack_e4;
  SubtreeArray SStack_e0;
  undefined8 uStack_d0;
  StackSlice *pSStack_c0;
  ulong uStack_b8;
  SubtreeArray SStack_b0;
  undefined8 uStack_a0;
  ReusableNode *pRStack_98;
  ulong uStack_90;
  SubtreeHeapData *pSStack_88;
  TSParser *pTStack_80;
  TSParser *pTStack_78;
  code *pcStack_70;
  char cStack_60;
  
  bVar30 = 0;
  uVar16 = (self->stack).size;
  if (uVar16 == 0) {
    pcStack_70 = (code *)0x13693e;
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x31,"void reusable_node_advance(ReusableNode *)");
  }
  uVar5 = uVar16 - 1;
  pSVar13 = (self->stack).contents;
  SVar12 = (Subtree)pSVar13[uVar5].tree.ptr;
  if (((ulong)SVar12.ptr & 1) == 0) {
    uVar4 = ((Length *)((long)SVar12 + 4))->bytes;
  }
  else {
    uVar4 = SVar12._2_4_ & 0xff;
  }
  uVar16 = pSVar13[uVar5].byte_offset;
  if (((ulong)SVar12.ptr & 1) == 0) {
    uVar5 = ((Length *)((long)SVar12 + 0x10))->bytes;
  }
  else {
    uVar5 = SVar12._3_4_ & 0xff;
  }
  if ((((ulong)SVar12.ptr & 1) == 0) && (((SVar12.ptr)->field_0x2c & 0x40) != 0)) {
    pcStack_70 = (code *)0x136813;
    SVar12 = ts_subtree_last_external_token(SVar12);
    self->last_external_token = SVar12;
  }
  uVar4 = uVar16 + uVar5 + uVar4;
  uVar5 = (self->stack).size - 1;
  do {
    (self->stack).size = uVar5;
    uVar11 = uVar5 - 1;
    if (uVar5 != 0) {
      if (uVar5 == 0) {
        pcStack_70 = (code *)0x13691f;
        __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                      ,0x3d,"void reusable_node_advance(ReusableNode *)");
      }
      unaff_R13 = pSVar13[uVar5 - 1].tree.ptr;
    }
    if (uVar5 == 0) {
      return;
    }
    uVar19 = 0;
    if (((ulong)unaff_R13 & 1) == 0) {
      uVar19 = unaff_R13->child_count;
    }
    uVar23 = pSVar13[uVar5].child_index + 1;
    uVar5 = uVar11;
  } while (uVar19 <= uVar23);
  uVar5 = (self->stack).capacity;
  if (uVar11 - uVar5 != -1) goto LAB_001368c9;
  pTVar28 = (TSParser *)0x8;
  if (8 < uVar5 * 2) {
    pTVar28 = (TSParser *)(ulong)(uVar5 * 2);
  }
  if ((uint)pTVar28 <= uVar5) goto LAB_001368c9;
  __nmemb = pTVar28;
  if (pSVar13 == (StackEntry *)0x0) {
LAB_001368ad:
    SStack_ec = 0x10;
    pcStack_70 = (code *)0x1368bd;
    pSVar13 = (StackEntry *)calloc((size_t)__nmemb,0x10);
    if (pSVar13 == (StackEntry *)0x0) {
      pcStack_70 = ts_parser__reduce;
      self_01 = __nmemb;
      reusable_node_advance_cold_2();
      uVar11 = (self_01->stack->heads).size;
      iStack_e4 = in_R8D;
      pRStack_98 = self;
      uStack_90 = (ulong)uVar23;
      pSStack_88 = unaff_R13;
      pTStack_80 = __nmemb;
      pTStack_78 = pTVar28;
      pcStack_70 = (code *)(ulong)uVar4;
      SVar31 = ts_stack_pop_count(self_01->stack,SStack_ec,uVar5);
      pSStack_c0 = SVar31.contents;
      uVar16 = SVar31.size;
      if (uVar16 != 0) {
        pool = &self_01->tree_pool;
        uStack_e8 = in_R9D & 0xffff;
        uVar14 = 0;
        iVar18 = 0;
        do {
          uStack_118 = SVar31._8_8_;
          uVar7 = uStack_118;
          pSVar26 = SVar31.contents;
          uStack_d0 = *(undefined8 *)&pSVar26[uVar14].version;
          pSVar2 = pSVar26 + uVar14;
          SStack_e0.contents = (pSVar2->subtrees).contents;
          SStack_e0.size = (pSVar2->subtrees).size;
          SStack_e0.capacity = (pSVar2->subtrees).capacity;
          uVar4 = (int)uStack_d0 - iVar18;
          uStack_118._0_4_ = SVar31.size;
          uVar5 = (uint)uStack_118;
          if (((int)uVar14 == 0) || (uVar4 < 0xb)) {
            uVar27 = SStack_e0._8_8_ & 0xffffffff;
            SStack_b0.size = SStack_e0.size;
            if (uVar27 != 0) {
              do {
                SStack_b0.size = (uint32_t)uVar27;
                uVar27 = uVar27 - 1;
                pSVar22 = SStack_e0.contents[uVar27 & 0xffffffff].ptr;
                if (((ulong)pSVar22 & 1) == 0) {
                  uVar19 = *(uint *)&pSVar22->field_0x2c >> 2;
                }
                else {
                  uVar19 = (uint)((ulong)pSVar22 >> 3) & 0x1fffffff;
                }
                if ((uVar19 & 1) == 0) goto LAB_00136acf;
              } while ((int)uVar27 != 0);
              SStack_b0.size = 0;
            }
LAB_00136acf:
            SStack_b0.capacity = SStack_e0.capacity;
            symbol = (TSSymbol)extraout_EDX;
            SStack_b0.contents = SStack_e0.contents;
            uStack_a0 = uStack_d0;
            SStack_f8 = (Subtree)ts_subtree_new_node(pool,symbol,&SStack_b0,uStack_e8,
                                                     self_01->language);
            do {
              SVar12 = SStack_f8;
              uVar19 = (int)uVar14 + 1;
              if ((uint)uStack_118 <= uVar19) break;
              uStack_100 = *(undefined8 *)&pSVar26[uVar19].version;
              pSVar2 = pSVar26 + uVar19;
              TStack_110.actions = (TSParseAction *)(pSVar2->subtrees).contents;
              TStack_110.action_count = (pSVar2->subtrees).size;
              TStack_110._12_4_ = (pSVar2->subtrees).capacity;
              iVar20 = (int)uStack_d0;
              iVar25 = (int)uStack_100;
              if (iVar25 == (int)uStack_d0) {
                uVar14 = TStack_110._8_8_ & 0xffffffff;
                uVar17 = TStack_110.action_count + 1;
                do {
                  bVar29 = uVar14 == 0;
                  uVar14 = uVar14 - 1;
                  if (bVar29) {
                    uVar17 = 0;
                    break;
                  }
                  pSVar22 = ((Subtree *)TStack_110.actions)[uVar14].ptr;
                  if (((ulong)pSVar22 & 1) == 0) {
                    uVar23 = *(uint *)&pSVar22->field_0x2c >> 2;
                  }
                  else {
                    uVar23 = (uint)((ulong)pSVar22 >> 3) & 0x1fffffff;
                  }
                  uVar17 = uVar17 - 1;
                } while ((uVar23 & 1) != 0);
                SVar21 = SStack_f8;
                pSVar22 = (self_01->scratch_tree).ptr;
                for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
                  uVar6 = ((Length *)((long)SVar21 + 4))->bytes;
                  pSVar22->ref_count = *(uint32_t *)SVar21;
                  (pSVar22->padding).bytes = uVar6;
                  SVar21.data = SVar21.data + (ulong)bVar30 * -0x10 + 8;
                  pSVar22 = (SubtreeHeapData *)((long)pSVar22 + (ulong)bVar30 * -0x10 + 8);
                }
                ((self_01->scratch_tree).ptr)->child_count = 0;
                ts_subtree_set_children
                          (self_01->scratch_tree,(Subtree *)TStack_110.actions,uVar17,
                           self_01->language);
                _Var10 = ts_parser__select_tree(self_01,SVar12,*(Subtree *)&self_01->scratch_tree);
                if (_Var10) {
                  pSVar22 = (self_01->scratch_tree).ptr;
                  for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
                    uVar17 = (pSVar22->padding).bytes;
                    *(uint32_t *)SVar12 = pSVar22->ref_count;
                    ((Length *)((long)SVar12 + 4))->bytes = uVar17;
                    pSVar22 = (SubtreeHeapData *)((long)pSVar22 + (ulong)bVar30 * -0x10 + 8);
                    SVar12.data = SVar12.data + (ulong)bVar30 * -0x10 + 8;
                  }
                  ts_subtree_array_delete(pool,&SStack_e0);
                  uStack_d0 = uStack_100;
                  SStack_e0.contents = (Subtree *)TStack_110.actions;
                  SStack_e0._8_8_ = TStack_110._8_8_;
                }
                else {
                  ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_110);
                }
                uVar14 = (ulong)uVar19;
              }
            } while (iVar25 == iVar20);
            piVar1 = &((SStack_f8.ptr)->field_17).field_0.dynamic_precedence;
            *piVar1 = *piVar1 + iStack_e4;
            ((SStack_f8.ptr)->field_17).field_0.alias_sequence_id = (uint16_t)in_R9D;
            if ((self_01->stack->heads).size <= uVar4) {
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
            }
            state_00 = ((self_01->stack->heads).contents[uVar4].node)->state;
            if (symbol < 0xfffe) {
              self_00 = self_01->language;
              if ((extraout_EDX & 0xffff) < self_00->token_count) {
                ts_language_table_entry(self_00,state_00,symbol,&TStack_110);
                if (TStack_110.action_count != 0) {
                  state = *(TSStateId *)(TStack_110.actions + (TStack_110.action_count - 1));
                  bVar3 = *(byte *)((long)TStack_110.actions +
                                   (ulong)(TStack_110.action_count - 1) * 8 + 6);
                  if (((bVar3 & 0xf) == 0) || ((bVar3 & 0xf) == 3)) goto LAB_00136c9b;
                }
                goto LAB_00136c48;
              }
              state = self_00->parse_table
                      [(uint)state_00 * self_00->symbol_count + (extraout_EDX & 0xffff)];
            }
            else {
LAB_00136c48:
              state = 0;
            }
LAB_00136c9b:
            SVar12 = SStack_f8;
            if (1 < uVar11 || (uVar16 != 1 || cStack_60 != '\0')) {
              (SStack_f8.ptr)->field_0x2c = (SStack_f8.ptr)->field_0x2c | 0x18;
              state_00 = TS_TREE_STATE_NONE;
            }
            (SStack_f8.ptr)->parse_state = state_00;
            uStack_b8 = uVar14;
            ts_stack_push(self_01->stack,uVar4,SStack_f8,false,state);
            pSVar9 = SStack_e0.contents;
            uVar27 = (ulong)(SVar12.ptr)->child_count;
            uVar14 = SStack_e0._8_8_ & 0xffffffff;
            if ((SVar12.ptr)->child_count < SStack_e0.size) {
              do {
                ts_stack_push(self_01->stack,uVar4,pSVar9[uVar27],false,state);
                uVar27 = uVar27 + 1;
              } while (uVar14 != uVar27);
            }
            pSVar26 = pSStack_c0;
            SVar8 = SStack_ec;
            iVar20 = (int)uStack_b8;
            if ((int)uStack_a0 != iVar18) {
              version1 = 0;
              do {
                if ((SVar8 != version1) &&
                   (_Var10 = ts_stack_merge(self_01->stack,version1,uVar4), _Var10)) {
                  iVar18 = iVar18 + 1;
                  break;
                }
                version1 = version1 + 1;
              } while (uVar4 != version1);
            }
          }
          else {
            ts_stack_remove_version(self_01->stack,uVar4);
            ts_subtree_array_delete(pool,&SStack_e0);
            iVar18 = iVar18 + 1;
            iVar25 = (int)uStack_d0;
            do {
              iVar20 = (int)uVar14;
              uVar4 = iVar20 + 1;
              if ((uint)uStack_118 <= uVar4) break;
              uStack_100 = *(undefined8 *)&pSVar26[uVar4].version;
              pSVar2 = pSVar26 + uVar4;
              TStack_110.actions = (TSParseAction *)(pSVar2->subtrees).contents;
              TStack_110.action_count = (pSVar2->subtrees).size;
              TStack_110._12_4_ = (pSVar2->subtrees).capacity;
              iVar24 = (int)uStack_100;
              if (iVar24 == iVar25) {
                ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_110);
                uVar14 = (ulong)uVar4;
              }
              iVar20 = (int)uVar14;
            } while (iVar24 == iVar25);
          }
          uStack_118._0_4_ = (uint)uVar7;
          uStack_118._4_4_ = SUB84(uVar7,4);
          SVar31.size = (uint)uStack_118;
          SVar31.capacity = uStack_118._4_4_;
          SVar31.contents = pSVar26;
          uVar14 = (ulong)(iVar20 + 1U);
        } while (iVar20 + 1U < uVar5);
      }
      return;
    }
  }
  else {
    pcStack_70 = (code *)0x1368a0;
    pSVar13 = (StackEntry *)realloc(pSVar13,(long)pTVar28 << 4);
    if (pSVar13 == (StackEntry *)0x0) {
      pcStack_70 = (code *)0x1368ad;
      reusable_node_advance_cold_1();
      __nmemb = extraout_RAX;
      goto LAB_001368ad;
    }
  }
  (self->stack).contents = pSVar13;
  (self->stack).capacity = (uint)pTVar28;
LAB_001368c9:
  pSVar13 = (self->stack).contents;
  uVar5 = (self->stack).size;
  (self->stack).size = uVar5 + 1;
  pSVar13[uVar5].tree = (unaff_R13->field_17).field_0.children[uVar23];
  pSVar13[uVar5].child_index = uVar23;
  pSVar13[uVar5].byte_offset = uVar4;
  return;
}

Assistant:

static inline void reusable_node_advance(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  uint32_t byte_offset = last_entry.byte_offset + ts_subtree_total_bytes(last_entry.tree);
  if (ts_subtree_has_external_tokens(last_entry.tree)) {
    self->last_external_token = ts_subtree_last_external_token(last_entry.tree);
  }

  Subtree tree;
  uint32_t next_index;
  do {
    StackEntry popped_entry = array_pop(&self->stack);
    next_index = popped_entry.child_index + 1;
    if (self->stack.size == 0) return;
    tree = array_back(&self->stack)->tree;
  } while (ts_subtree_child_count(tree) <= next_index);

  array_push(&self->stack, ((StackEntry) {
    .tree = tree.ptr->children[next_index],
    .child_index = next_index,
    .byte_offset = byte_offset,
  }));
}